

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,dynamic_string_array *params,uint n,param_desc *pParam_desc)

{
  uint16 uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  dynamic_string *pdVar9;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *ppVar10;
  uint uVar11;
  param_desc *ppVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar18;
  bool bVar19;
  bool bVar20;
  dynamic_string_array strings;
  dynamic_string filename;
  param_value pv;
  dynamic_string key_str;
  dynamic_string val_str [16];
  dynamic_string_array local_1c8;
  undefined4 local_1b0;
  uint local_1ac;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_1a8;
  dynamic_string_array *local_180;
  param_value local_178;
  dynamic_string local_160;
  param_desc *local_150;
  _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
  *local_148;
  ulong local_140;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_138 [6];
  ulong uVar17;
  
  local_150 = pParam_desc;
  vector<crnlib::dynamic_string>::operator=(&this->m_params,params);
  bVar20 = params->m_size == 0;
  if (!bVar20) {
    local_140 = (ulong)n;
    local_148 = (_Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                 *)&this->m_param_map;
    uVar16 = 0;
    local_1ac = n;
    local_180 = params;
    do {
      uVar4 = (uint)uVar16;
      uVar14 = uVar4 + 1;
      uVar1 = params->m_p[uVar16].m_len;
      if (uVar1 == 0) {
        bVar19 = false;
      }
      else {
        pdVar9 = params->m_p + uVar16;
        pcVar13 = pdVar9->m_pStr;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "";
        }
        if (*pcVar13 == '-') {
          if (uVar1 == 1) {
            console::error("Invalid command line parameter: \"%s\"");
            bVar19 = true;
          }
          else {
            dynamic_string::dynamic_string(&local_160,pdVar9);
            dynamic_string::right(&local_160,1);
            pcVar13 = local_160.m_pStr;
            if (local_160.m_pStr == (char *)0x0) {
              pcVar13 = "";
            }
            if (pcVar13[local_160.m_len - 1] == '+') {
              bVar19 = false;
              local_1b0 = 0x1afd01;
            }
            else if (pcVar13[local_160.m_len - 1] == '-') {
              local_1b0 = 0xff;
              bVar19 = false;
            }
            else {
              bVar19 = true;
              local_1b0 = 0;
            }
            if (!bVar19) {
              dynamic_string::left(&local_160,local_160.m_len - 1);
            }
            if (n == 0) {
              uVar15 = 0;
            }
            else {
              uVar16 = 0;
              ppVar12 = local_150;
              do {
                iVar7 = dynamic_string::compare(&local_160,ppVar12->m_pName,false);
                uVar17 = uVar16;
                if (iVar7 == 0) break;
                uVar16 = uVar16 + 1;
                ppVar12 = ppVar12 + 1;
                uVar17 = local_140;
              } while (local_140 != uVar16);
              uVar15 = (uint)uVar17;
              n = local_1ac;
            }
            ppVar12 = local_150;
            if (uVar15 == n) {
              pcVar13 = pdVar9->m_pStr;
              if (pcVar13 == (char *)0x0) {
                pcVar13 = "";
              }
              bVar19 = true;
              console::error("Unrecognized command line parameter: \"%s\"",pcVar13);
            }
            else {
              lVar8 = 0;
              do {
                *(undefined4 *)((long)&local_138[0].first.m_buf_size + lVar8) = 0;
                *(undefined8 *)((long)&local_138[0].first.m_pStr + lVar8) = 0;
                lVar8 = lVar8 + 0x10;
              } while (lVar8 != 0x100);
              uVar2 = local_150[uVar15].m_num_values;
              uVar11 = 0;
              if (uVar2 == 0) {
LAB_0010ea46:
                local_1c8.m_p = (dynamic_string *)0x0;
                local_1c8.m_size = 0;
                local_1c8.m_capacity = 0;
                if ((ppVar12[uVar15].m_support_listing_file == true) &&
                   (1 < local_138[0].first.m_len)) {
                  pcVar13 = local_138[0].first.m_pStr;
                  if (local_138[0].first.m_pStr == (char *)0x0) {
                    pcVar13 = "";
                  }
                  if (*pcVar13 != '@') goto LAB_0010eaf4;
                  dynamic_string::dynamic_string(&local_1a8.first,&local_138[0].first);
                  dynamic_string::right(&local_1a8.first,1);
                  dynamic_string::unquote(&local_1a8.first);
                  pcVar13 = (char *)CONCAT44(local_1a8.first.m_pStr._4_4_,
                                             (uint)local_1a8.first.m_pStr);
                  if (pcVar13 == (char *)0x0) {
                    pcVar13 = "";
                  }
                  bVar6 = load_string_file(pcVar13,&local_1c8);
                  pcVar13 = (char *)CONCAT44(local_1a8.first.m_pStr._4_4_,
                                             (uint)local_1a8.first.m_pStr);
                  if (bVar6) {
                    if ((pcVar13 != (char *)0x0) &&
                       ((*(uint *)(pcVar13 + -8) ^ *(uint *)(pcVar13 + -4)) == 0xffffffff)) {
                      crnlib_free(pcVar13 + -0x10);
                    }
                    goto LAB_0010eb50;
                  }
                  if (pcVar13 == (char *)0x0) {
                    pcVar13 = "";
                  }
                  console::error("Failed loading listing file \"%s\"!",pcVar13);
                  lVar8 = CONCAT44(local_1a8.first.m_pStr._4_4_,(uint)local_1a8.first.m_pStr);
                  if ((lVar8 != 0) &&
                     ((*(uint *)(lVar8 + -8) ^ *(uint *)(lVar8 + -4)) == 0xffffffff)) {
                    crnlib_free((void *)(lVar8 + -0x10));
                  }
                  bVar19 = true;
                  if (bVar6) goto LAB_0010eb50;
                }
                else {
LAB_0010eaf4:
                  if (uVar11 != 0) {
                    uVar16 = (ulong)uVar11;
                    ppVar10 = local_138;
                    do {
                      dynamic_string::unquote(&ppVar10->first);
                      if (local_1c8.m_capacity <= local_1c8.m_size) {
                        elemental_vector::increase_capacity
                                  ((elemental_vector *)&local_1c8,local_1c8.m_size + 1,true,0x10,
                                   (object_mover)0x0,false);
                      }
                      dynamic_string::dynamic_string
                                (local_1c8.m_p + (local_1c8._8_8_ & 0xffffffff),&ppVar10->first);
                      local_1c8.m_size = local_1c8.m_size + 1;
                      ppVar10 = (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>
                                 *)&ppVar10->second;
                      uVar16 = uVar16 - 1;
                    } while (uVar16 != 0);
                  }
LAB_0010eb50:
                  local_178.m_values.m_p = local_1c8.m_p;
                  local_1c8.m_p = (dynamic_string *)0x0;
                  local_178.m_values.m_size = local_1c8.m_size;
                  local_178.m_values.m_capacity = local_1c8.m_capacity;
                  local_1c8.m_size = 0;
                  local_1c8.m_capacity = 0;
                  local_178.m_modifier = (int8)local_1b0;
                  local_178.m_index = uVar4;
                  std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
                  pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                            (&local_1a8,&local_160,&local_178);
                  std::
                  _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                  ::
                  _M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                            (local_148,&local_1a8);
                  lVar8 = CONCAT44(local_1a8.second.m_values.m_p._4_4_,
                                   (uint)local_1a8.second.m_values.m_p);
                  if (lVar8 != 0) {
                    uVar16 = (ulong)local_1a8.second.m_values.m_size;
                    if (uVar16 != 0) {
                      lVar18 = 0;
                      do {
                        lVar3 = *(long *)(lVar8 + 8 + lVar18);
                        if ((lVar3 != 0) &&
                           ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
                          crnlib_free((void *)(lVar3 + -0x10));
                        }
                        lVar18 = lVar18 + 0x10;
                      } while (uVar16 << 4 != lVar18);
                    }
                    crnlib_free((void *)CONCAT44(local_1a8.second.m_values.m_p._4_4_,
                                                 (uint)local_1a8.second.m_values.m_p));
                  }
                  lVar8 = CONCAT44(local_1a8.first.m_pStr._4_4_,(uint)local_1a8.first.m_pStr);
                  if ((lVar8 != 0) &&
                     ((*(uint *)(lVar8 + -8) ^ *(uint *)(lVar8 + -4)) == 0xffffffff)) {
                    crnlib_free((void *)(lVar8 + -0x10));
                  }
                  pdVar9 = local_178.m_values.m_p;
                  if (local_178.m_values.m_p != (dynamic_string *)0x0) {
                    uVar16 = (ulong)local_178.m_values.m_size;
                    if (uVar16 != 0) {
                      lVar8 = 0;
                      do {
                        lVar18 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                        if ((lVar18 != 0) &&
                           ((*(uint *)(lVar18 + -8) ^ *(uint *)(lVar18 + -4)) == 0xffffffff)) {
                          crnlib_free((void *)(lVar18 + -0x10));
                        }
                        lVar8 = lVar8 + 0x10;
                      } while (uVar16 << 4 != lVar8);
                    }
                    crnlib_free(local_178.m_values.m_p);
                  }
                  bVar19 = false;
                }
                pdVar9 = local_1c8.m_p;
                if (local_1c8.m_p != (dynamic_string *)0x0) {
                  uVar16 = local_1c8._8_8_ & 0xffffffff;
                  if (uVar16 != 0) {
                    lVar8 = 0;
                    do {
                      lVar18 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                      if ((lVar18 != 0) &&
                         ((*(uint *)(lVar18 + -8) ^ *(uint *)(lVar18 + -4)) == 0xffffffff)) {
                        crnlib_free((void *)(lVar18 + -0x10));
                      }
                      lVar8 = lVar8 + 0x10;
                    } while (uVar16 << 4 != lVar8);
                  }
                  crnlib_free(local_1c8.m_p);
                }
              }
              else {
                if (uVar2 + uVar14 <= local_180->m_size) {
                  uVar11 = 0;
                  if (local_150[uVar15].m_num_values != 0) {
                    uVar11 = 0;
                    ppVar10 = local_138;
                    do {
                      dynamic_string::set(&ppVar10->first,local_180->m_p + (uVar14 + uVar11),
                                          0xffffffff);
                      ppVar10 = (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>
                                 *)&ppVar10->second;
                      uVar11 = uVar11 + 1;
                    } while (uVar11 < ppVar12[uVar15].m_num_values);
                    uVar14 = uVar14 + uVar11;
                  }
                  goto LAB_0010ea46;
                }
                pcVar13 = pdVar9->m_pStr;
                if (pcVar13 == (char *)0x0) {
                  pcVar13 = "";
                }
                bVar19 = true;
                console::error("Expected %u value(s) after command line parameter: \"%s\"",
                               (ulong)uVar2,pcVar13);
              }
              n = local_1ac;
              lVar8 = 0x100;
              do {
                lVar18 = *(long *)((long)&local_140 + lVar8);
                if ((lVar18 != 0) &&
                   ((*(uint *)(lVar18 + -8) ^ *(uint *)(lVar18 + -4)) == 0xffffffff)) {
                  crnlib_free((void *)(lVar18 + -0x10));
                }
                lVar8 = lVar8 + -0x10;
              } while (lVar8 != 0);
            }
            params = local_180;
            if ((local_160.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_160.m_pStr + -8) ^ *(uint *)(local_160.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_160.m_pStr + -0x10);
            }
          }
        }
        else {
          local_1a8.first._0_8_ = (dynamic_string *)0x0;
          local_1a8.first.m_pStr._0_4_ = 0;
          local_1a8.first.m_pStr._4_4_ = 0;
          local_1a8.second.m_values.m_p._0_4_ = 0;
          local_1a8.second.m_values.m_p._4_4_ = local_1a8.second.m_values.m_p._4_4_ & 0xffffff00;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_1a8,1,true,0x10,(object_mover)0x0,false);
          dynamic_string::dynamic_string
                    ((dynamic_string *)
                     (local_1a8.first._0_8_ + (ulong)(uint)local_1a8.first.m_pStr * 0x10),pdVar9);
          uVar16 = (ulong)(uint)local_1a8.first.m_pStr;
          local_1a8.first.m_pStr._0_4_ = (uint)local_1a8.first.m_pStr + 1;
          dynamic_string::unquote((dynamic_string *)(local_1a8.first._0_8_ + uVar16 * 0x10));
          local_1a8.second.m_values.m_p._0_4_ = uVar4;
          std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
          pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                    (local_138,(dynamic_string *)g_empty_dynamic_string,(param_value *)&local_1a8);
          std::
          _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
          ::
          _M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                    (local_148,local_138);
          pdVar9 = local_138[0].second.m_values.m_p;
          if (local_138[0].second.m_values.m_p != (dynamic_string *)0x0) {
            uVar16 = (ulong)local_138[0].second.m_values.m_size;
            if (uVar16 != 0) {
              lVar8 = 0;
              do {
                lVar18 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                if ((lVar18 != 0) &&
                   ((*(uint *)(lVar18 + -8) ^ *(uint *)(lVar18 + -4)) == 0xffffffff)) {
                  crnlib_free((void *)(lVar18 + -0x10));
                }
                lVar8 = lVar8 + 0x10;
              } while (uVar16 << 4 != lVar8);
            }
            crnlib_free(local_138[0].second.m_values.m_p);
          }
          if ((local_138[0].first.m_pStr != (char *)0x0) &&
             ((*(uint *)(local_138[0].first.m_pStr + -8) ^ *(uint *)(local_138[0].first.m_pStr + -4)
              ) == 0xffffffff)) {
            crnlib_free(local_138[0].first.m_pStr + -0x10);
          }
          uVar5 = local_1a8.first._0_8_;
          if ((dynamic_string *)local_1a8.first._0_8_ != (dynamic_string *)0x0) {
            uVar16 = (ulong)(uint)local_1a8.first.m_pStr;
            if (uVar16 != 0) {
              lVar8 = 0;
              do {
                lVar18 = *(long *)(uVar5 + 8 + lVar8);
                if ((lVar18 != 0) &&
                   ((*(uint *)(lVar18 + -8) ^ *(uint *)(lVar18 + -4)) == 0xffffffff)) {
                  crnlib_free((void *)(lVar18 + -0x10));
                }
                lVar8 = lVar8 + 0x10;
              } while (uVar16 << 4 != lVar8);
            }
            crnlib_free((void *)local_1a8.first._0_8_);
          }
          bVar19 = false;
          params = local_180;
        }
      }
      if (bVar19) {
        return bVar20;
      }
      uVar16 = (ulong)uVar14;
      bVar19 = uVar14 < params->m_size;
      bVar20 = !bVar19;
    } while (bVar19);
  }
  return bVar20;
}

Assistant:

bool command_line_params::parse(const dynamic_string_array& params, uint n, const param_desc* pParam_desc)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        m_params = params;

        uint arg_index = 0;
        while (arg_index < params.size())
        {
            const uint cur_arg_index = arg_index;
            const dynamic_string& src_param = params[arg_index++];

            if (src_param.is_empty())
            {
                continue;
            }
#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
            if ((src_param[0] == '/') || (src_param[0] == '-'))
#else
            if (src_param[0] == '-')
#endif
            {
                if (src_param.get_len() < 2)
                {
                    console::error("Invalid command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                dynamic_string key_str(src_param);

                key_str.right(1);

                int modifier = 0;
                char c = key_str[key_str.get_len() - 1];
                if (c == '+')
                {
                    modifier = 1;
                }
                else if (c == '-')
                {
                    modifier = -1;
                }
                if (modifier)
                {
                    key_str.left(key_str.get_len() - 1);
                }
                uint param_index;
                for (param_index = 0; param_index < n; param_index++)
                {
                    if (key_str == pParam_desc[param_index].m_pName)
                    {
                        break;
                    }
                }

                if (param_index == n)
                {
                    console::error("Unrecognized command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                const param_desc& desc = pParam_desc[param_index];

                const uint cMaxValues = 16;
                dynamic_string val_str[cMaxValues];
                uint num_val_strs = 0;
                if (desc.m_num_values)
                {
                    CRNLIB_ASSERT(desc.m_num_values <= cMaxValues);

                    if ((arg_index + desc.m_num_values) > params.size())
                    {
                        console::error("Expected %u value(s) after command line parameter: \"%s\"", desc.m_num_values, src_param.get_ptr());
                        return false;
                    }

                    for (uint v = 0; v < desc.m_num_values; v++)
                    {
                        val_str[num_val_strs++] = params[arg_index++];
                    }
                }

                dynamic_string_array strings;

                if ((desc.m_support_listing_file) && (val_str[0].get_len() >= 2) && (val_str[0][0] == '@'))
                {
                    dynamic_string filename(val_str[0]);
                    filename.right(1);
                    filename.unquote();

                    if (!load_string_file(filename.get_ptr(), strings))
                    {
                        console::error("Failed loading listing file \"%s\"!", filename.get_ptr());
                        return false;
                    }
                }
                else
                {
                    for (uint v = 0; v < num_val_strs; v++)
                    {
                        val_str[v].unquote();
                        strings.push_back(val_str[v]);
                    }
                }

                param_value pv;
                pv.m_values.swap(strings);
                pv.m_index = cur_arg_index;
                pv.m_modifier = (int8)modifier;
                m_param_map.insert(std::make_pair(key_str, pv));
            }
            else
            {
                param_value pv;
                pv.m_values.push_back(src_param);
                pv.m_values.back().unquote();
                pv.m_index = cur_arg_index;
                m_param_map.insert(std::make_pair(g_empty_dynamic_string, pv));
            }
        }

        return true;
    }